

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O1

bool btGjkEpaSolver2::Distance
               (btConvexShape *shape0,btTransform *wtrs0,btConvexShape *shape1,btTransform *wtrs1,
               btVector3 *guess,sResults *results)

{
  float fVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _ _Var6;
  code *pcVar7;
  long *plVar8;
  ulong uVar9;
  undefined8 uVar10;
  float in_XMM1_Da;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  btVector3 bVar15;
  tShape shape;
  GJK gjk;
  float local_2e8;
  float fStack_2e4;
  btVector3 local_2a0;
  tShape local_290;
  GJK local_200;
  
  gjkepa2_impl::Initialize(shape0,wtrs0,shape1,wtrs1,results,&local_290,false);
  local_200.m_nfree = 0;
  local_200.m_current = 0;
  local_200.m_ray.m_floats[0] = 0.0;
  local_200.m_ray.m_floats[1] = 0.0;
  local_200.m_ray.m_floats[2] = 0.0;
  local_200.m_ray.m_floats[3] = 0.0;
  local_200.m_status = Failed;
  local_200.m_distance = 0.0;
  _Var6 = gjkepa2_impl::GJK::Evaluate(&local_200,&local_290,guess);
  if (_Var6 == Valid) {
    fStack_2e4 = 0.0;
    local_2e8 = 0.0;
    fVar11 = 0.0;
    fVar12 = 0.0;
    fVar13 = 0.0;
    fVar14 = 0.0;
    if ((local_200.m_simplex)->rank != 0) {
      uVar9 = 0;
      local_2e8 = 0.0;
      fStack_2e4 = 0.0;
      do {
        plVar8 = (long *)((long)&(local_290.m_shapes[0]->super_btCollisionShape).
                                 _vptr_btCollisionShape + local_290._136_8_);
        pcVar7 = (code *)local_290.Ls;
        if ((local_290.Ls & 1) != 0) {
          pcVar7 = *(code **)(local_290.Ls + *plVar8 + -1);
        }
        fVar1 = (local_200.m_simplex)->p[uVar9];
        uVar10 = (*pcVar7)(plVar8,(local_200.m_simplex)->c[uVar9]);
        local_2e8 = local_2e8 + in_XMM1_Da * fVar1;
        fStack_2e4 = fStack_2e4 + (float)((ulong)uVar10 >> 0x20) * fVar1;
        uVar2 = *(ulong *)((local_200.m_simplex)->c[uVar9]->d).m_floats ^ 0x8000000080000000;
        local_2a0.m_floats[2] = -((local_200.m_simplex)->c[uVar9]->d).m_floats[2];
        local_2a0.m_floats[0] = (btScalar)(int)uVar2;
        local_2a0.m_floats[1] = (btScalar)(int)(uVar2 >> 0x20);
        local_2a0.m_floats[3] = 0.0;
        bVar15 = gjkepa2_impl::MinkowskiDiff::Support(&local_290,&local_2a0,1);
        in_XMM1_Da = bVar15.m_floats[2];
        fVar11 = fVar11 + bVar15.m_floats[0] * fVar1;
        fVar12 = fVar12 + bVar15.m_floats[1] * fVar1;
        fVar13 = fVar13 + in_XMM1_Da * fVar1;
        fVar14 = fVar14 + (float)uVar10 * fVar1;
        uVar9 = uVar9 + 1;
      } while (uVar9 < (local_200.m_simplex)->rank);
    }
    uVar10 = *(undefined8 *)(wtrs0->m_origin).m_floats;
    auVar4._4_4_ = (float)((ulong)uVar10 >> 0x20) +
                   (wtrs0->m_basis).m_el[1].m_floats[2] * local_2e8 +
                   (wtrs0->m_basis).m_el[1].m_floats[0] * fVar14 +
                   (wtrs0->m_basis).m_el[1].m_floats[1] * fStack_2e4;
    auVar4._0_4_ = (float)uVar10 +
                   (wtrs0->m_basis).m_el[0].m_floats[2] * local_2e8 +
                   (wtrs0->m_basis).m_el[0].m_floats[0] * fVar14 +
                   (wtrs0->m_basis).m_el[0].m_floats[1] * fStack_2e4;
    auVar4._8_4_ = (wtrs0->m_basis).m_el[2].m_floats[2] * local_2e8 +
                   (wtrs0->m_basis).m_el[2].m_floats[0] * fVar14 +
                   (wtrs0->m_basis).m_el[2].m_floats[1] * fStack_2e4 + (wtrs0->m_origin).m_floats[2]
    ;
    auVar4._12_4_ = 0;
    *(undefined1 (*) [16])results->witnesses[0].m_floats = auVar4;
    uVar10 = *(undefined8 *)(wtrs0->m_origin).m_floats;
    auVar5._4_4_ = (float)((ulong)uVar10 >> 0x20) +
                   (wtrs0->m_basis).m_el[1].m_floats[2] * fVar13 +
                   (wtrs0->m_basis).m_el[1].m_floats[0] * fVar11 +
                   (wtrs0->m_basis).m_el[1].m_floats[1] * fVar12;
    auVar5._0_4_ = (float)uVar10 +
                   (wtrs0->m_basis).m_el[0].m_floats[2] * fVar13 +
                   (wtrs0->m_basis).m_el[0].m_floats[0] * fVar11 +
                   (wtrs0->m_basis).m_el[0].m_floats[1] * fVar12;
    auVar5._8_4_ = (wtrs0->m_basis).m_el[2].m_floats[2] * fVar13 +
                   (wtrs0->m_basis).m_el[2].m_floats[0] * fVar11 +
                   (wtrs0->m_basis).m_el[2].m_floats[1] * fVar12 + (wtrs0->m_origin).m_floats[2];
    auVar5._12_4_ = 0;
    *(undefined1 (*) [16])results->witnesses[1].m_floats = auVar5;
    auVar3._4_4_ = fStack_2e4 - fVar12;
    auVar3._0_4_ = fVar14 - fVar11;
    auVar3._8_4_ = local_2e8 - fVar13;
    auVar3._12_4_ = 0;
    *(undefined1 (*) [16])(results->normal).m_floats = auVar3;
    fVar11 = (results->normal).m_floats[0];
    fVar12 = (results->normal).m_floats[1];
    fVar13 = (results->normal).m_floats[2];
    fVar11 = fVar13 * fVar13 + fVar11 * fVar11 + fVar12 * fVar12;
    if (fVar11 < 0.0) {
      fVar11 = sqrtf(fVar11);
    }
    else {
      fVar11 = SQRT(fVar11);
    }
    results->distance = fVar11;
    fVar11 = (float)(~-(uint)(0.0001 < fVar11) & 0x3f800000 |
                    (uint)(1.0 / fVar11) & -(uint)(0.0001 < fVar11));
    uVar10 = *(undefined8 *)(results->normal).m_floats;
    *(ulong *)(results->normal).m_floats =
         CONCAT44(fVar11 * (float)((ulong)uVar10 >> 0x20),fVar11 * (float)uVar10);
    (results->normal).m_floats[2] = fVar11 * (results->normal).m_floats[2];
  }
  else {
    results->status = (_Var6 != Inside) + Penetrating;
  }
  return _Var6 == Valid;
}

Assistant:

bool		btGjkEpaSolver2::Distance(	const btConvexShape*	shape0,
									  const btTransform&		wtrs0,
									  const btConvexShape*	shape1,
									  const btTransform&		wtrs1,
									  const btVector3&		guess,
									  sResults&				results)
{
	tShape			shape;
	Initialize(shape0,wtrs0,shape1,wtrs1,results,shape,false);
	GJK				gjk;
	GJK::eStatus::_	gjk_status=gjk.Evaluate(shape,guess);
	if(gjk_status==GJK::eStatus::Valid)
	{
		btVector3	w0=btVector3(0,0,0);
		btVector3	w1=btVector3(0,0,0);
		for(U i=0;i<gjk.m_simplex->rank;++i)
		{
			const btScalar	p=gjk.m_simplex->p[i];
			w0+=shape.Support( gjk.m_simplex->c[i]->d,0)*p;
			w1+=shape.Support(-gjk.m_simplex->c[i]->d,1)*p;
		}
		results.witnesses[0]	=	wtrs0*w0;
		results.witnesses[1]	=	wtrs0*w1;
		results.normal			=	w0-w1;
		results.distance		=	results.normal.length();
		results.normal			/=	results.distance>GJK_MIN_DISTANCE?results.distance:1;
		return(true);
	}
	else
	{
		results.status	=	gjk_status==GJK::eStatus::Inside?
			sResults::Penetrating	:
		sResults::GJK_Failed	;
		return(false);
	}
}